

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int little2_contentTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  byte *pbVar10;
  char *pcVar11;
  byte *pbVar12;
  byte bVar13;
  byte *end_00;
  long lVar14;
  bool bVar15;
  int local_44;
  byte *local_40;
  byte *local_38;
  
  if (ptr == end) {
    return -4;
  }
  uVar7 = (long)end - (long)ptr & 0xfffffffffffffffe;
  end_00 = (byte *)(ptr + uVar7);
  if (uVar7 == 0) {
    end_00 = (byte *)end;
  }
  bVar15 = ((long)end - (long)ptr & 1U) != 0;
  if (!bVar15) {
    end_00 = (byte *)end;
  }
  if (bVar15 && uVar7 == 0) {
    return -1;
  }
  bVar1 = ptr[1];
  if (bVar1 - 0xd8 < 4) {
switchD_00475489_caseD_7:
    if ((long)end_00 - (long)ptr < 4) {
      return -2;
    }
    pbVar12 = (byte *)(ptr + 4);
    goto LAB_004754fe;
  }
  if (bVar1 - 0xdc < 4) goto switchD_00475489_caseD_0;
  if (bVar1 == 0) {
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
    case 0:
    case 1:
    case 8:
      goto switchD_00475489_caseD_0;
    case 2:
      pbVar12 = (byte *)(ptr + 2);
      if (pbVar12 == end_00) {
        return -1;
      }
      bVar1 = ptr[3];
      if (bVar1 - 0xd8 < 4) {
switchD_004756ef_caseD_7:
        if ((long)end_00 - (long)pbVar12 < 4) {
          return -2;
        }
        goto switchD_004756ef_caseD_8;
      }
      if (bVar1 - 0xdc < 4) goto switchD_004756ef_caseD_8;
      if (bVar1 == 0) {
        bVar13 = *pbVar12;
        cVar2 = *(char *)((long)enc[1].scanners + (ulong)bVar13);
        switch(cVar2) {
        case '\x05':
          if ((long)end_00 - (long)pbVar12 < 2) {
            return -2;
          }
          break;
        case '\x06':
          if ((long)end_00 - (long)pbVar12 < 3) {
            return -2;
          }
          break;
        case '\a':
          goto switchD_004756ef_caseD_7;
        case '\b':
        case '\t':
        case '\n':
        case '\v':
        case '\f':
        case '\r':
        case '\x0e':
        case '\x12':
        case '\x13':
        case '\x14':
        case '\x15':
        case '\x17':
          break;
        case '\x0f':
          iVar3 = little2_scanPi(enc,ptr + 4,(char *)end_00,nextTokPtr);
          return iVar3;
        case '\x10':
          pbVar12 = (byte *)(ptr + 4);
          if (pbVar12 == end_00) {
            return -1;
          }
          if (ptr[5] == '\0') {
            cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar12);
            if (cVar2 == '\x14') {
              pcVar9 = ptr + 6;
              if ((long)end_00 - (long)pcVar9 < 0xc) {
                return -1;
              }
              lVar14 = 0;
              iVar3 = 8;
              do {
                pcVar11 = ptr + 0x12;
                if (lVar14 == 6) {
LAB_00475cb4:
                  *nextTokPtr = pcVar11;
                  return iVar3;
                }
                if ((pcVar9[1] != '\0') || (*pcVar9 != (&big2_scanCdataSection_CDATA_LSQB)[lVar14]))
                {
                  iVar3 = 0;
                  pcVar11 = pcVar9;
                  goto LAB_00475cb4;
                }
                lVar14 = lVar14 + 1;
                pcVar9 = pcVar9 + 2;
              } while( true );
            }
            if (cVar2 == '\x1b') {
              iVar3 = little2_scanComment(enc,ptr + 6,(char *)end_00,nextTokPtr);
              return iVar3;
            }
          }
          break;
        case '\x11':
          pbVar12 = (byte *)(ptr + 4);
          if (pbVar12 == end_00) {
            return -1;
          }
          bVar1 = ptr[5];
          iVar3 = 0;
          if (bVar1 - 0xd8 < 4) {
LAB_00475b71:
            if ((long)end_00 - (long)pbVar12 < 4) {
              return -2;
            }
          }
          else {
            if (bVar1 - 0xdc < 4) goto switchD_00475c7c_caseD_8;
            if (bVar1 == 0) {
              bVar13 = *pbVar12;
              cVar2 = *(char *)((long)enc[1].scanners + (ulong)bVar13);
              if (cVar2 == '\x05') {
                if ((long)end_00 - (long)pbVar12 < 2) {
                  return -2;
                }
                goto switchD_00475c7c_caseD_8;
              }
              if (cVar2 == '\x06') {
                if ((long)end_00 - (long)pbVar12 < 3) {
                  return -2;
                }
                goto switchD_00475c7c_caseD_8;
              }
              if (cVar2 == '\a') goto LAB_00475b71;
              if (cVar2 == '\x16') goto LAB_00475bbd;
              if (cVar2 != '\x1d') {
                if (cVar2 != '\x18') goto switchD_00475c7c_caseD_8;
                goto LAB_00475bbd;
              }
            }
            else if (bVar1 == 0xff) {
              bVar13 = *pbVar12;
              if (0xfd < bVar13) goto switchD_00475c7c_caseD_8;
            }
            else {
              bVar13 = *pbVar12;
            }
            if ((*(uint *)((long)namingBitmap +
                          (ulong)(bVar13 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)
                          ) >> (bVar13 & 0x1f) & 1) != 0) {
LAB_00475bbd:
              pbVar12 = (byte *)(ptr + 6);
              pbVar10 = end_00 + (-6 - (long)ptr);
              while( true ) {
                if (pbVar12 == end_00) {
                  return -1;
                }
                bVar1 = pbVar12[1];
                if (bVar1 == 0) break;
                if (bVar1 == 0xff) {
                  uVar5 = (uint)*pbVar12;
                  if (0xfd < *pbVar12) goto switchD_00475c7c_caseD_8;
                }
                else {
                  if (bVar1 - 0xd8 < 4) goto switchD_00475c7c_caseD_7;
                  if (bVar1 - 0xdc < 4) goto switchD_00475c7c_caseD_8;
                  uVar5 = (uint)*pbVar12;
                }
switchD_00475c7c_caseD_1d:
                if ((*(uint *)((long)namingBitmap +
                              (ulong)(uVar5 >> 3 & 0x1c |
                                     (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
                     (uVar5 & 0x1f) & 1) == 0) goto switchD_00475c7c_caseD_8;
switchD_00475c7c_caseD_16:
                pbVar12 = pbVar12 + 2;
                pbVar10 = pbVar10 + -2;
              }
              uVar5 = (uint)*pbVar12;
              pbVar4 = pbVar12;
              switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar12)) {
              case 5:
                if ((long)pbVar10 < 2) {
                  return -2;
                }
                break;
              case 6:
                if ((long)pbVar10 < 3) {
                  return -2;
                }
                break;
              case 7:
switchD_00475c7c_caseD_7:
                if ((long)pbVar10 < 4) {
                  return -2;
                }
              default:
                break;
              case 9:
              case 10:
              case 0x15:
                goto switchD_00475c7c_caseD_9;
              case 0xb:
                goto switchD_00475c7c_caseD_b;
              case 0x16:
              case 0x17:
              case 0x18:
              case 0x19:
              case 0x1a:
              case 0x1b:
                goto switchD_00475c7c_caseD_16;
              case 0x1d:
                goto switchD_00475c7c_caseD_1d;
              }
            }
          }
switchD_00475c7c_caseD_8:
          *nextTokPtr = (char *)pbVar12;
          return iVar3;
        case '\x16':
        case '\x18':
          goto switchD_004756ef_caseD_16;
        default:
          if (cVar2 != '\x1d') break;
          goto LAB_00475718;
        }
      }
      else {
        if (bVar1 == 0xff) {
          bVar13 = *pbVar12;
          if (0xfd < bVar13) goto switchD_004756ef_caseD_8;
        }
        else {
          bVar13 = *pbVar12;
        }
LAB_00475718:
        if ((*(uint *)((long)namingBitmap +
                      (ulong)(bVar13 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
             (bVar13 & 0x1f) & 1) != 0) {
switchD_004756ef_caseD_16:
          ptr = ptr + 4;
          bVar15 = false;
          lVar14 = 4;
          do {
            if ((byte *)ptr == end_00) {
              return -1;
            }
            bVar1 = ((byte *)ptr)[1];
            lVar8 = 2;
            if (bVar1 == 0) {
              uVar5 = (uint)(byte)*ptr;
              switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
              case 5:
                lVar14 = (long)end_00 - (long)ptr;
                goto joined_r0x004761f1;
              case 6:
                lVar14 = (long)end_00 - (long)ptr;
                goto joined_r0x004761e2;
              case 7:
switchD_0047580a_caseD_7:
                lVar14 = (long)end_00 - (long)ptr;
                goto joined_r0x00475adb;
              default:
                goto switchD_00475489_caseD_0;
              case 9:
              case 10:
              case 0x15:
                lVar14 = (long)end_00 - (long)ptr;
                local_40 = (byte *)ptr;
                goto LAB_004759fa;
              case 0xb:
                goto switchD_0047580a_caseD_b;
              case 0x11:
                goto switchD_0047580a_caseD_11;
              case 0x16:
              case 0x18:
              case 0x19:
              case 0x1a:
              case 0x1b:
                break;
              case 0x17:
                if (bVar15) goto switchD_00475489_caseD_0;
                pbVar12 = (byte *)ptr + 2;
                if (pbVar12 == end_00) {
                  return -1;
                }
                bVar1 = ((byte *)ptr)[3];
                lVar8 = lVar14;
                if (bVar1 == 0) {
                  uVar5 = (uint)*pbVar12;
                  cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar12);
                  bVar15 = true;
                  if ((cVar2 == '\x16') || (cVar2 == '\x18')) break;
                  if (cVar2 != '\x1d') {
                    if (cVar2 == '\x05') {
                      if ((long)end_00 - (long)pbVar12 < 2) {
                        return -2;
                      }
                      goto LAB_00475ca7;
                    }
                    if (cVar2 == '\x06') {
                      if ((long)end_00 - (long)pbVar12 < 3) {
                        return -2;
                      }
                      goto LAB_00475ca7;
                    }
                    if (cVar2 != '\a') goto LAB_00475ca7;
                    goto LAB_00475c9e;
                  }
                }
                else if (bVar1 == 0xff) {
                  uVar5 = (uint)*pbVar12;
                  if (0xfd < *pbVar12) goto LAB_00475ca7;
                }
                else {
                  if (bVar1 - 0xd8 < 4) {
LAB_00475c9e:
                    if ((long)end_00 - (long)pbVar12 < 4) {
                      return -2;
                    }
                    goto LAB_00475ca7;
                  }
                  if (bVar1 - 0xdc < 4) goto LAB_00475ca7;
                  uVar5 = (uint)*pbVar12;
                }
                bVar15 = true;
                if ((*(uint *)((long)namingBitmap +
                              (ulong)(uVar5 >> 3 & 0x1c |
                                     (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
                     (uVar5 & 0x1f) & 1) == 0) {
LAB_00475ca7:
                  *nextTokPtr = (char *)pbVar12;
                  return 0;
                }
                break;
              case 0x1d:
                goto switchD_0047580a_caseD_1d;
              }
            }
            else {
              if (bVar1 == 0xff) {
                uVar5 = (uint)(byte)*ptr;
                if (0xfd < (byte)*ptr) goto switchD_00475489_caseD_0;
              }
              else {
                if (bVar1 - 0xd8 < 4) goto switchD_0047580a_caseD_7;
                if (bVar1 - 0xdc < 4) goto switchD_00475489_caseD_0;
                uVar5 = (uint)(byte)*ptr;
              }
switchD_0047580a_caseD_1d:
              if ((*(uint *)((long)namingBitmap +
                            (ulong)(uVar5 >> 3 & 0x1c |
                                   (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
                   (uVar5 & 0x1f) & 1) == 0) goto switchD_00475489_caseD_0;
            }
            ptr = (char *)((byte *)ptr + lVar8);
          } while( true );
        }
      }
switchD_004756ef_caseD_8:
      *nextTokPtr = (char *)pbVar12;
      return 0;
    case 3:
      iVar3 = little2_scanRef(enc,ptr + 2,(char *)end_00,nextTokPtr);
      return iVar3;
    case 4:
      pbVar12 = (byte *)(ptr + 2);
      if (pbVar12 == end_00) {
        return -5;
      }
      if ((ptr[3] == '\0') && (*pbVar12 == 0x5d)) {
        pbVar10 = (byte *)(ptr + 4);
        if (pbVar10 == end_00) {
          return -5;
        }
        if ((ptr[5] == '\0') && (*pbVar10 == 0x3e)) {
          *nextTokPtr = (char *)pbVar10;
          return 0;
        }
      }
      break;
    case 5:
      if ((long)end_00 - (long)ptr < 2) {
        return -2;
      }
    default:
switchD_00475489_default:
      pbVar12 = (byte *)(ptr + 2);
      break;
    case 6:
      if ((long)end_00 - (long)ptr < 3) {
        return -2;
      }
      pbVar12 = (byte *)(ptr + 3);
      break;
    case 7:
      goto switchD_00475489_caseD_7;
    case 9:
      pbVar12 = (byte *)(ptr + 2);
      if (pbVar12 == end_00) {
        return -3;
      }
      if ((ptr[3] == '\0') && (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[2]) == '\n')) {
        pbVar12 = (byte *)(ptr + 4);
      }
      *nextTokPtr = (char *)pbVar12;
      return 7;
    case 10:
      *nextTokPtr = ptr + 2;
      return 7;
    }
LAB_004754fe:
    while( true ) {
      pbVar10 = pbVar12;
      if (pbVar10 == end_00) goto switchD_00475579_caseD_0;
      bVar1 = pbVar10[1];
      if (3 < bVar1 - 0xd8) break;
switchD_00475579_caseD_7:
      if ((long)end_00 - (long)pbVar10 < 4) goto switchD_00475579_caseD_0;
      pbVar12 = pbVar10 + 4;
    }
    if (bVar1 != 0) {
      if (bVar1 == 0xff) {
        if (0xfd < *pbVar10) goto switchD_00475579_caseD_0;
      }
      else if (bVar1 - 0xdc < 4) goto switchD_00475579_caseD_0;
      goto switchD_00475579_default;
    }
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar10)) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 8:
    case 9:
    case 10:
      goto switchD_00475579_caseD_0;
    case 4:
      pbVar12 = pbVar10 + 2;
      if (pbVar12 == end_00) goto switchD_00475579_caseD_0;
      if ((pbVar10[3] != 0) || (*pbVar12 != 0x5d)) goto LAB_004754fe;
      ptr = (char *)(pbVar10 + 4);
      if ((byte *)ptr == end_00) goto switchD_00475579_caseD_0;
      if ((pbVar10[5] != 0) || (*ptr != 0x3e)) goto LAB_004754fe;
      break;
    case 5:
      if ((long)end_00 - (long)pbVar10 < 2) goto switchD_00475579_caseD_0;
    default:
switchD_00475579_default:
      pbVar12 = pbVar10 + 2;
      goto LAB_004754fe;
    case 6:
      if ((long)end_00 - (long)pbVar10 < 3) {
switchD_00475579_caseD_0:
        *nextTokPtr = (char *)pbVar10;
        return 6;
      }
      pbVar12 = pbVar10 + 3;
      goto LAB_004754fe;
    case 7:
      goto switchD_00475579_caseD_7;
    }
switchD_00475489_caseD_0:
    *nextTokPtr = ptr;
    return 0;
  }
  if ((bVar1 == 0xff) && (0xfd < (byte)*ptr)) goto switchD_00475489_caseD_0;
  goto switchD_00475489_default;
  while ((bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar12), pbVar4 = pbVar12,
         bVar1 - 9 < 2 || (bVar1 == 0x15))) {
switchD_00475c7c_caseD_9:
    pbVar12 = pbVar4 + 2;
    if (pbVar12 == end_00) {
      return -1;
    }
    if (pbVar4[3] != 0) goto switchD_00475c7c_caseD_8;
  }
  if (bVar1 == 0xb) {
switchD_00475c7c_caseD_b:
    pbVar12 = pbVar12 + 2;
    iVar3 = 5;
  }
  goto switchD_00475c7c_caseD_8;
LAB_004759fa:
  ptr = (char *)(local_40 + 2);
  lVar14 = lVar14 + -2;
  if ((byte *)ptr == end_00) {
    return -1;
  }
  bVar1 = local_40[3];
  uVar7 = (ulong)bVar1;
  if (bVar1 == 0) {
    uVar5 = (uint)(byte)*ptr;
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
    case 5:
joined_r0x004761f1:
      if (lVar14 < 2) {
        return -2;
      }
      goto switchD_00475489_caseD_0;
    case 6:
joined_r0x004761e2:
      if (lVar14 < 3) {
        return -2;
      }
      goto switchD_00475489_caseD_0;
    case 7:
      goto switchD_00475a2a_caseD_7;
    default:
      goto switchD_00475489_caseD_0;
    case 9:
    case 10:
    case 0x15:
      goto switchD_00475a2a_caseD_9;
    case 0xb:
      goto switchD_0047580a_caseD_b;
    case 0x11:
      goto switchD_0047580a_caseD_11;
    case 0x16:
    case 0x18:
      goto switchD_00475a2a_caseD_16;
    case 0x1d:
      uVar7 = 0;
    }
  }
  else {
    if (bVar1 - 0xd8 < 4) {
switchD_00475a2a_caseD_7:
joined_r0x00475adb:
      if (lVar14 < 4) {
        return -2;
      }
      goto switchD_00475489_caseD_0;
    }
    if (bVar1 - 0xdc < 4) goto switchD_00475489_caseD_0;
    if (bVar1 == 0xff) {
      uVar5 = (uint)(byte)*ptr;
      uVar7 = 0xff;
      if ((byte)*ptr < 0xfe) goto LAB_00475d38;
      goto switchD_00475489_caseD_0;
    }
    uVar5 = (uint)(byte)*ptr;
  }
LAB_00475d38:
  if ((*(uint *)((long)namingBitmap +
                (ulong)(uVar5 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[uVar7] << 5)) >>
       (uVar5 & 0x1f) & 1) == 0) goto switchD_00475489_caseD_0;
switchD_00475a2a_caseD_16:
  local_38 = end_00 + -4;
  bVar15 = false;
LAB_00475d88:
  pbVar12 = local_40 + 4;
  pbVar10 = pbVar12;
  local_40 = pbVar12;
LAB_00475d92:
  pbVar4 = local_40 + 2;
  if (local_40 == end_00) {
    return -1;
  }
  bVar1 = local_40[1];
  if (bVar1 != 0) {
    if (bVar1 == 0xff) {
      uVar5 = (uint)*local_40;
      if (*local_40 < 0xfe) goto switchD_00475e41_caseD_1d;
    }
    else {
      if (bVar1 - 0xd8 < 4) goto switchD_00475e41_caseD_7;
      if (3 < bVar1 - 0xdc) {
        uVar5 = (uint)*local_40;
        goto switchD_00475e41_caseD_1d;
      }
    }
    goto switchD_00475e41_caseD_8;
  }
  uVar5 = (uint)*local_40;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*local_40)) {
  case 5:
    if ((long)end_00 - (long)pbVar10 < 2) {
      return -2;
    }
    break;
  case 6:
    if ((long)end_00 - (long)pbVar10 < 3) {
      return -2;
    }
    break;
  case 7:
switchD_00475e41_caseD_7:
    if ((long)end_00 - (long)pbVar10 < 4) {
      return -2;
    }
    break;
  case 9:
  case 10:
  case 0x15:
    goto switchD_00475e41_caseD_9;
  case 0xe:
    pbVar12 = local_40;
    goto LAB_00475f0c;
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    goto switchD_00475e41_caseD_16;
  case 0x17:
    if (bVar15) goto switchD_00475fd1_caseD_0;
    if (pbVar4 == end_00) {
      return -1;
    }
    pbVar12 = pbVar12 + 2;
    bVar1 = local_40[3];
    local_44 = 0;
    if (bVar1 == 0) {
      uVar5 = (uint)*pbVar4;
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar4);
      if ((cVar2 == '\x16') || (cVar2 == '\x18')) {
        bVar15 = true;
        goto LAB_00475d88;
      }
      if (cVar2 != '\x1d') {
        if (cVar2 == '\x05') {
          pbVar10 = end_00 + (-2 - (long)pbVar10);
          goto joined_r0x004762d2;
        }
        if (cVar2 != '\x06') {
          local_40 = pbVar4;
          if (cVar2 == '\a') goto LAB_00476297;
          goto switchD_00475fd1_caseD_0;
        }
        pbVar10 = end_00 + (-2 - (long)pbVar10);
        goto joined_r0x004762eb;
      }
    }
    else if (bVar1 == 0xff) {
      uVar5 = (uint)*pbVar4;
      if (0xfd < *pbVar4) goto switchD_00476137_caseD_8;
    }
    else {
      if (bVar1 - 0xd8 < 4) {
LAB_00476297:
        pbVar10 = end_00 + (-2 - (long)pbVar10);
        goto joined_r0x004762a5;
      }
      if (bVar1 - 0xdc < 4) goto switchD_00476137_caseD_8;
      uVar5 = (uint)*pbVar4;
    }
    bVar15 = true;
    if ((*(uint *)((long)namingBitmap +
                  (ulong)(uVar5 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
         (uVar5 & 0x1f) & 1) != 0) goto LAB_00475d88;
    goto switchD_00476137_caseD_8;
  case 0x1d:
switchD_00475e41_caseD_1d:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)(uVar5 >> 3 & 0x1c | (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
         (uVar5 & 0x1f) & 1) != 0) goto switchD_00475e41_caseD_16;
  }
switchD_00475e41_caseD_8:
  local_44 = 0;
  pbVar12 = local_40;
  goto switchD_00476137_caseD_8;
switchD_00475e41_caseD_16:
  pbVar12 = pbVar12 + 2;
  pbVar10 = pbVar10 + 2;
  local_40 = pbVar4;
  goto LAB_00475d92;
switchD_00475e41_caseD_9:
  local_40 = pbVar4;
  if (local_40 == end_00) {
    return -1;
  }
  if (local_40[1] != 0) goto switchD_00475fd1_caseD_0;
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*local_40);
  if ((1 < bVar1 - 9) && (bVar1 != 0x15)) goto code_r0x00475e92;
  pbVar4 = local_40 + 2;
  goto switchD_00475e41_caseD_9;
code_r0x00475e92:
  pbVar12 = local_40;
  if (bVar1 == 0xe) {
LAB_00475f0c:
    do {
      local_40 = pbVar12 + 2;
      if (local_40 == end_00) {
        return -1;
      }
      if (pbVar12[3] != 0) break;
      uVar5 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*local_40);
      if ((uVar5 & 0xfffffffe) == 0xc) {
switchD_00475fd1_caseD_4:
        local_40 = local_40 + 2;
        do {
          local_44 = 0;
          if (local_40 == end_00) {
            return -1;
          }
          bVar1 = local_40[1];
          uVar6 = 7;
          if (3 < bVar1 - 0xd8) {
            if (bVar1 - 0xdc < 4) {
              uVar6 = 8;
            }
            else if (bVar1 == 0xff) {
              uVar6 = 0;
              if (*local_40 < 0xfe) goto LAB_00475fb0;
            }
            else if (bVar1 == 0) {
              uVar6 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*local_40);
            }
            else {
LAB_00475fb0:
              uVar6 = 0x1d;
            }
          }
          if (uVar6 == uVar5) {
            pbVar12 = local_40 + 2;
            if (pbVar12 == end_00) {
              return -1;
            }
            if (local_40[3] != 0) goto switchD_00476137_caseD_8;
            bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar12);
            if ((bVar1 - 9 < 2) || (bVar1 == 0x15)) {
              pbVar10 = local_38 + -(long)local_40;
              local_40 = pbVar12;
              goto LAB_004760fc;
            }
            if (bVar1 == 0xb) goto switchD_00476137_caseD_b;
            pbVar10 = pbVar12;
            if (bVar1 != 0x11) goto switchD_00476137_caseD_8;
            goto LAB_00476309;
          }
          switch(uVar6) {
          case 0:
          case 1:
          case 2:
          case 8:
            goto switchD_00475fd1_caseD_0;
          case 3:
            iVar3 = little2_scanRef(enc,(char *)(local_40 + 2),(char *)end_00,(char **)&local_40);
            if (iVar3 < 1) {
              pbVar12 = local_40;
              if (iVar3 != 0) {
                return iVar3;
              }
              goto switchD_00476137_caseD_8;
            }
            break;
          default:
            goto switchD_00475fd1_caseD_4;
          case 5:
            if ((long)end_00 - (long)local_40 < 2) {
              return -2;
            }
            goto switchD_00475fd1_caseD_4;
          case 6:
            if ((long)end_00 - (long)local_40 < 3) {
              return -2;
            }
            local_40 = local_40 + 3;
            break;
          case 7:
            if ((long)end_00 - (long)local_40 < 4) {
              return -2;
            }
            local_40 = local_40 + 4;
          }
        } while( true );
      }
      if ((0x15 < uVar5) || (pbVar12 = local_40, (0x200600U >> (uVar5 & 0x1f) & 1) == 0)) break;
    } while( true );
  }
switchD_00475fd1_caseD_0:
  local_44 = 0;
  pbVar12 = local_40;
  goto switchD_00476137_caseD_8;
LAB_004760fc:
  pbVar4 = local_40 + 2;
  if (pbVar4 == end_00) {
    return -1;
  }
  bVar1 = local_40[3];
  pbVar12 = pbVar4;
  if (bVar1 != 0) {
    if (bVar1 - 0xd8 < 4) {
switchD_00476137_caseD_7:
joined_r0x004762a5:
      local_44 = 0;
      pbVar12 = pbVar4;
      if ((long)pbVar10 < 4) {
        return -2;
      }
    }
    else if ((3 < bVar1 - 0xdc) && ((bVar1 != 0xff || (local_40[2] < 0xfe))))
    goto switchD_00476137_caseD_1d;
    goto switchD_00476137_caseD_8;
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar4)) {
  case 5:
joined_r0x004762d2:
    local_44 = 0;
    pbVar12 = pbVar4;
    if ((long)pbVar10 < 2) {
      return -2;
    }
    break;
  case 6:
joined_r0x004762eb:
    local_44 = 0;
    pbVar12 = pbVar4;
    if ((long)pbVar10 < 3) {
      return -2;
    }
    break;
  case 7:
    goto switchD_00476137_caseD_7;
  default:
    break;
  case 9:
  case 10:
  case 0x15:
    goto switchD_00476137_caseD_9;
  case 0xb:
    goto switchD_00476137_caseD_b;
  case 0x11:
    pbVar10 = local_40 + 2;
LAB_00476309:
    pbVar12 = pbVar10 + 2;
    if (pbVar12 == end_00) {
      return -1;
    }
    if (pbVar10[3] == 0) {
      if (pbVar10[2] == 0x3e) {
        pbVar12 = pbVar10 + 4;
      }
      local_44 = (uint)(pbVar10[2] == 0x3e) * 3;
    }
    break;
  case 0x16:
  case 0x18:
    goto switchD_00476137_caseD_16;
  case 0x1d:
switchD_00476137_caseD_1d:
    bVar15 = false;
    if ((*(uint *)((long)namingBitmap +
                  (ulong)(local_40[2] >> 3 & 0x1c |
                         (uint)"\x02\x03\x04\x05\x06\a\b"[local_40[3]] << 5)) >>
         (local_40[2] & 0x1f) & 1) != 0) goto LAB_00475d88;
    local_44 = 0;
    pbVar12 = local_40 + 2;
  }
  goto switchD_00476137_caseD_8;
switchD_00476137_caseD_16:
  bVar15 = false;
  goto LAB_00475d88;
switchD_00476137_caseD_9:
  pbVar10 = pbVar10 + -2;
  local_40 = pbVar4;
  goto LAB_004760fc;
switchD_0047580a_caseD_11:
  pbVar12 = (byte *)ptr + 2;
  if (pbVar12 == end_00) {
    return -1;
  }
  if ((((byte *)ptr)[3] == 0) && (*pbVar12 == 0x3e)) {
    *nextTokPtr = (char *)((byte *)ptr + 4);
    return 4;
  }
  goto switchD_004756ef_caseD_8;
switchD_00475a2a_caseD_9:
  local_40 = (byte *)ptr;
  goto LAB_004759fa;
switchD_0047580a_caseD_b:
  *nextTokPtr = (char *)((byte *)ptr + 2);
  return 2;
switchD_00476137_caseD_b:
  pbVar12 = local_40 + 4;
  local_44 = 1;
switchD_00476137_caseD_8:
  *nextTokPtr = (char *)pbVar12;
  return local_44;
}

Assistant:

static
int PREFIX(contentTok)(const ENCODING *enc, const char *ptr, const char *end,
                       const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_LT:
    return PREFIX(scanLt)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_AMP:
    return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_CR:
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_TRAILING_CR;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) { \
        *nextTokPtr = ptr; \
        return XML_TOK_DATA_CHARS; \
      } \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_RSQB:
      if (ptr + MINBPC(enc) != end) {
         if (!CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_RSQB)) {
           ptr += MINBPC(enc);
           break;
         }
         if (ptr + 2*MINBPC(enc) != end) {
           if (!CHAR_MATCHES(enc, ptr + 2*MINBPC(enc), ASCII_GT)) {
             ptr += MINBPC(enc);
             break;
           }
           *nextTokPtr = ptr + 2*MINBPC(enc);
           return XML_TOK_INVALID;
         }
      }
      /* fall through */
    case BT_AMP:
    case BT_LT:
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}